

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visitObject(PostResolutionChecks *this,Statement *t)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  pool_ptr<soul::AST::Expression> e;
  pool_ptr<soul::AST::Expression> local_98;
  pool_ptr<soul::AST::Expression> local_90;
  CompileMessage local_88;
  CompileMessage local_50;
  
  cast<soul::AST::Expression,soul::AST::Statement>((soul *)&local_98,t);
  if (local_98.object != (Expression *)0x0) {
    local_90.object = local_98.object;
    bVar1 = AST::isResolvedAsType(&local_90);
    if (bVar1) {
      Errors::expectedStatement<>();
      AST::Context::throwError(&(t->super_ASTObject).context,&local_50,false);
    }
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&local_98);
    iVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xe])(pEVar3);
    if ((char)iVar2 != '\0') {
      Errors::expressionHasNoEffect<>();
      AST::Context::throwError(&(t->super_ASTObject).context,&local_88,false);
    }
  }
  ASTVisitor::visitObject(&this->super_ASTVisitor,t);
  return;
}

Assistant:

void visitObject (AST::Statement& t) override
        {
            if (auto e = cast<AST::Expression> (t))
            {
                if (AST::isResolvedAsType (e))
                    t.context.throwError (Errors::expectedStatement());

                if (e->isCompileTimeConstant())
                    t.context.throwError (Errors::expressionHasNoEffect());
            }

            super::visitObject (t);
        }